

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

int linenoiseHistoryLoad(char *filename)

{
  FILE *__stream;
  char *pcVar1;
  char *local_1030;
  char *p;
  char buf [4096];
  FILE *fp;
  char *filename_local;
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    filename_local._4_4_ = -1;
  }
  else {
    while (pcVar1 = fgets((char *)&p,0x1000,__stream), pcVar1 != (char *)0x0) {
      local_1030 = strchr((char *)&p,0xd);
      if (local_1030 == (char *)0x0) {
        local_1030 = strchr((char *)&p,10);
      }
      if (local_1030 != (char *)0x0) {
        *local_1030 = '\0';
      }
      linenoiseHistoryAdd((char *)&p);
    }
    fclose(__stream);
    filename_local._4_4_ = 0;
  }
  return filename_local._4_4_;
}

Assistant:

int linenoiseHistoryLoad(const char *filename) {
	FILE *fp = fopen(filename,"r");
	char buf[LINENOISE_MAX_LINE];

	if (fp == NULL) return -1;

	while (fgets(buf,LINENOISE_MAX_LINE,fp) != NULL) {
		char *p;

		p = strchr(buf,'\r');
		if (!p) p = strchr(buf,'\n');
		if (p) *p = '\0';
		linenoiseHistoryAdd(buf);
	}
	fclose(fp);
	return 0;
}